

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O1

void __thiscall
antlr::TokenStreamRecognitionException::TokenStreamRecognitionException
          (TokenStreamRecognitionException *this,RecognitionException *re)

{
  pointer pcVar1;
  int iVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  (*(re->super_ANTLRException)._vptr_ANTLRException[3])(&local_48);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_00302108;
  (this->super_TokenStreamException).super_ANTLRException.text._M_dataplus._M_p =
       (pointer)&(this->super_TokenStreamException).super_ANTLRException.text.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_TokenStreamException).super_ANTLRException.text,local_48,
             local_40 + (long)local_48);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_003026a8;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamRecognitionException_00302708;
  (this->recog).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__ANTLRException_00302108;
  (this->recog).super_ANTLRException.text._M_dataplus._M_p =
       (pointer)&(this->recog).super_ANTLRException.text.field_2;
  pcVar1 = (re->super_ANTLRException).text._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->recog).super_ANTLRException.text,pcVar1,
             pcVar1 + (re->super_ANTLRException).text._M_string_length);
  (this->recog).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_00303080;
  (this->recog).fileName._M_dataplus._M_p = (pointer)&(this->recog).fileName.field_2;
  pcVar1 = (re->fileName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->recog).fileName,pcVar1,pcVar1 + (re->fileName)._M_string_length);
  iVar2 = re->column;
  (this->recog).line = re->line;
  (this->recog).column = iVar2;
  return;
}

Assistant:

TokenStreamRecognitionException(RecognitionException& re)
	: TokenStreamException(re.getMessage())
	, recog(re)
	{
	}